

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

void __thiscall ON_XMLNodePrivate::AddEmptyDefaultProperty(ON_XMLNodePrivate *this)

{
  ON_XMLVariant local_170;
  ON_XMLProperty local_78;
  ON_XMLNodePrivate *local_10;
  ON_XMLNodePrivate *this_local;
  
  local_10 = this;
  ::ON_XMLVariant::ON_XMLVariant(&local_170,L"");
  ON_XMLProperty::ON_XMLProperty(&local_78,&local_170);
  AddProperty(this,&local_78,false);
  ON_XMLProperty::~ON_XMLProperty(&local_78);
  ::ON_XMLVariant::~ON_XMLVariant(&local_170);
  return;
}

Assistant:

void ON_XMLNodePrivate::AddEmptyDefaultProperty(void)
{
  AddProperty(ON_XMLProperty(L""));
}